

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_sse2.c
# Opt level: O0

void transpose4x4(float *A,float *B,int lda,int ldb)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_f4;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_d4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_8c;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 row4;
  __m128 row3;
  __m128 row2;
  __m128 row1;
  
  uVar1 = in_RDI[1];
  puVar8 = (undefined8 *)((long)in_RDI + (long)in_EDX * 4);
  uVar2 = *puVar8;
  uVar3 = puVar8[1];
  puVar8 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 1) * 4);
  uVar4 = *puVar8;
  uVar5 = puVar8[1];
  puVar8 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 3) * 4);
  uVar6 = *puVar8;
  uVar7 = puVar8[1];
  uStack_d4 = (undefined4)((ulong)*in_RDI >> 0x20);
  local_e8 = (undefined4)uVar2;
  uStack_e4 = (undefined4)((ulong)uVar2 >> 0x20);
  uStack_f4 = (undefined4)((ulong)uVar4 >> 0x20);
  local_108 = (undefined4)uVar6;
  uStack_104 = (undefined4)((ulong)uVar6 >> 0x20);
  uStack_8c = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_a0 = (undefined4)uVar3;
  uStack_9c = (undefined4)((ulong)uVar3 >> 0x20);
  uStack_ac = (undefined4)((ulong)uVar5 >> 0x20);
  uStack_c0 = (undefined4)uVar7;
  uStack_bc = (undefined4)((ulong)uVar7 >> 0x20);
  local_1e8 = CONCAT44(uStack_e4,uStack_d4);
  uStack_1e0 = CONCAT44(uStack_104,uStack_f4);
  local_208 = CONCAT44(uStack_9c,uStack_8c);
  uStack_200 = CONCAT44(uStack_bc,uStack_ac);
  *in_RSI = CONCAT44(local_e8,(int)*in_RDI);
  in_RSI[1] = CONCAT44(local_108,(int)uVar4);
  puVar8 = (undefined8 *)((long)in_RSI + (long)in_ECX * 4);
  *puVar8 = local_1e8;
  puVar8[1] = uStack_1e0;
  puVar8 = (undefined8 *)((long)in_RSI + (long)(in_ECX << 1) * 4);
  *puVar8 = CONCAT44(uStack_a0,(int)uVar1);
  puVar8[1] = CONCAT44(uStack_c0,(int)uVar5);
  puVar8 = (undefined8 *)((long)in_RSI + (long)(in_ECX * 3) * 4);
  *puVar8 = local_208;
  puVar8[1] = uStack_200;
  return;
}

Assistant:

static inline void transpose4x4(const float *A, float *B, const int lda,
                                const int ldb) {
  __m128 row1 = _mm_load_ps(&A[0 * lda]);
  __m128 row2 = _mm_load_ps(&A[1 * lda]);
  __m128 row3 = _mm_load_ps(&A[2 * lda]);
  __m128 row4 = _mm_load_ps(&A[3 * lda]);
  _MM_TRANSPOSE4_PS(row1, row2, row3, row4);
  _mm_store_ps(&B[0 * ldb], row1);
  _mm_store_ps(&B[1 * ldb], row2);
  _mm_store_ps(&B[2 * ldb], row3);
  _mm_store_ps(&B[3 * ldb], row4);
}